

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaTargetGenerator::AddFeatureFlags(cmNinjaTargetGenerator *this,string *flags,string *lang)

{
  cmLocalNinjaGenerator *this_00;
  bool bVar1;
  string *config;
  allocator local_41;
  string local_40;
  string *local_20;
  string *lang_local;
  string *flags_local;
  cmNinjaTargetGenerator *this_local;
  
  this_00 = this->LocalGenerator;
  local_20 = lang;
  lang_local = flags;
  flags_local = (string *)this;
  config = GetConfigName_abi_cxx11_(this);
  cmLocalGenerator::AddLanguageFlags(&this_00->super_cmLocalGenerator,flags,lang,config);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"INTERPROCEDURAL_OPTIMIZATION",&local_41);
  bVar1 = GetFeatureAsBool(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if (bVar1) {
    cmLocalGenerator::AppendFeatureOptions
              (&this->LocalGenerator->super_cmLocalGenerator,lang_local,local_20,"IPO");
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::AddFeatureFlags(std::string& flags,
                                             const std::string& lang)
{
  // Add language-specific flags.
  this->LocalGenerator->AddLanguageFlags(flags, lang, this->GetConfigName());

  if(this->GetFeatureAsBool("INTERPROCEDURAL_OPTIMIZATION"))
    {
    this->LocalGenerator->AppendFeatureOptions(flags, lang, "IPO");
    }
}